

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallmon.cpp
# Opt level: O1

void __thiscall wallmon::wallmon(wallmon *this)

{
  _Rb_tree_header *p_Var1;
  pointer ppVar2;
  pointer pcVar3;
  pointer ppVar4;
  initializer_list<prmon::parameter> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [32];
  _Alloc_hider local_160;
  char local_150 [16];
  _Alloc_hider local_140;
  char local_130 [16];
  string local_120;
  string local_100;
  string local_e0;
  monitored_value local_c0;
  
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Imonitor)._vptr_Imonitor = (_func_int **)&PTR__wallmon_001b5958;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"wtime","");
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"s","");
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  prmon::parameter::parameter(&local_c0.m_param,&local_e0,&local_100,&local_120);
  __l._M_len = 1;
  __l._M_array = &local_c0.m_param;
  std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::vector
            (&this->params,__l,(allocator_type *)&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_param.m_avg_unit._M_dataplus._M_p != &local_c0.m_param.m_avg_unit.field_2) {
    operator_delete(local_c0.m_param.m_avg_unit._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_param.m_max_unit._M_dataplus._M_p != &local_c0.m_param.m_max_unit.field_2) {
    operator_delete(local_c0.m_param.m_max_unit._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_param.m_name._M_dataplus._M_p != &local_c0.m_param.m_name.field_2) {
    operator_delete(local_c0.m_param.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  p_Var1 = &(this->walltime_stats)._M_t._M_impl.super__Rb_tree_header;
  (this->walltime_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->walltime_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->walltime_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->walltime_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->walltime_stats)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->got_mother_starttime = false;
  local_c0.m_param.m_name._M_dataplus._M_p = (pointer)&local_c0.m_param.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"wallmon","");
  MessageBase::log_init(&this->super_MessageBase,(string *)&local_c0,&global_logging_level);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_param.m_name._M_dataplus._M_p != &local_c0.m_param.m_name.field_2) {
    operator_delete(local_c0.m_param.m_name._M_dataplus._M_p);
  }
  ppVar4 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar2) {
    do {
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      pcVar3 = (ppVar4->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,pcVar3,pcVar3 + (ppVar4->m_name)._M_string_length);
      local_180._0_8_ = local_180 + 0x10;
      pcVar3 = (ppVar4->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_180,pcVar3,pcVar3 + (ppVar4->m_name)._M_string_length);
      local_160._M_p = local_150;
      pcVar3 = (ppVar4->m_max_unit)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar3,pcVar3 + (ppVar4->m_max_unit)._M_string_length);
      pcVar3 = (ppVar4->m_avg_unit)._M_dataplus._M_p;
      local_140._M_p = local_130;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,pcVar3,pcVar3 + (ppVar4->m_avg_unit)._M_string_length);
      prmon::monitored_value::monitored_value(&local_c0,(parameter *)local_180,true,0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
      ::_M_emplace_unique<std::__cxx11::string_const,prmon::monitored_value>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
                  *)&this->walltime_stats,&local_1a0,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_param.m_avg_unit._M_dataplus._M_p != &local_c0.m_param.m_avg_unit.field_2) {
        operator_delete(local_c0.m_param.m_avg_unit._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_param.m_max_unit._M_dataplus._M_p != &local_c0.m_param.m_max_unit.field_2) {
        operator_delete(local_c0.m_param.m_max_unit._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_param.m_name._M_dataplus._M_p != &local_c0.m_param.m_name.field_2) {
        operator_delete(local_c0.m_param.m_name._M_dataplus._M_p);
      }
      if (local_140._M_p != local_130) {
        operator_delete(local_140._M_p);
      }
      if (local_160._M_p != local_150) {
        operator_delete(local_160._M_p);
      }
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar2);
  }
  return;
}

Assistant:

wallmon::wallmon() : got_mother_starttime{false} {
  log_init(MONITOR_NAME);
#undef MONITOR_NAME
  for (const auto& param : params) {
    walltime_stats.emplace(param.get_name(),
                           prmon::monitored_value(param, true));
  }
}